

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::loadNative(SchemaLoader *this,RawSchema *nativeSchema)

{
  Own<capnp::SchemaLoader::Impl> *this_00;
  Impl *this_01;
  RawSchema *local_18;
  RawSchema *nativeSchema_local;
  SchemaLoader *this_local;
  
  local_18 = nativeSchema;
  nativeSchema_local = (RawSchema *)this;
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_> *)&stack0xffffffffffffffd8);
  this_00 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::operator->
                      ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)&stack0xffffffffffffffd8);
  this_01 = kj::Own<capnp::SchemaLoader::Impl>::get(this_00);
  Impl::loadNative(this_01,local_18);
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void SchemaLoader::loadNative(const _::RawSchema* nativeSchema) {
  impl.lockExclusive()->get()->loadNative(nativeSchema);
}